

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

string * __thiscall helics::helicsDoubleString_abi_cxx11_(double val)

{
  string *in_RDI;
  undefined1 in_stack_000001c0 [16];
  undefined1 in_stack_000001d0 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [24];
  undefined8 local_60;
  undefined1 *local_58;
  char *local_50;
  undefined8 local_48;
  undefined1 *local_40;
  char *local_38;
  undefined8 local_30;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_38 = "{}";
  local_30 = 2;
  local_40 = local_88;
  local_50 = "{}";
  local_48 = 2;
  local_18 = local_78;
  local_8 = &local_60;
  local_10 = local_78;
  local_60 = 10;
  local_58 = local_10;
  ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_000001d0,(format_args)in_stack_000001c0);
  return in_RDI;
}

Assistant:

std::string helicsDoubleString(double val)
{
    return fmt::format("{}", val);
}